

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar_ustar.c
# Opt level: O2

void test_write_format_tar_ustar(void)

{
  int iVar1;
  wchar_t wVar2;
  char *p;
  archive *_a;
  archive_entry *paVar3;
  la_ssize_t lVar4;
  char cVar5;
  long lVar6;
  size_t used;
  char f99 [100];
  char f100 [101];
  char f256 [257];
  
  cVar5 = 'a';
  for (lVar6 = 0; lVar6 != 99; lVar6 = lVar6 + 1) {
    f99[lVar6] = cVar5 + (char)(((ushort)lVar6 & 0xff) / 0x1a) * -0x1a;
    cVar5 = cVar5 + '\x01';
  }
  f99[99] = '\0';
  cVar5 = 'A';
  for (lVar6 = 0; lVar6 != 100; lVar6 = lVar6 + 1) {
    f100[lVar6] = cVar5 + (char)(((ushort)lVar6 & 0xff) / 0x1a) * -0x1a;
    cVar5 = cVar5 + '\x01';
  }
  f100[100] = '\0';
  cVar5 = 'A';
  for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
    f256[lVar6] = cVar5 + (char)(((ushort)lVar6 & 0xff) / 0x1a) * -0x1a;
    cVar5 = cVar5 + '\x01';
  }
  f256[0x9b] = '/';
  f256[0x100] = '\0';
  p = (char *)malloc(100000);
  _a = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'M',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'O',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",_a);
  iVar1 = archive_write_add_filter_none(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Q',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",_a);
  iVar1 = archive_write_open_memory(_a,p,100000,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'S',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used)",_a);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'[',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_set_pathname(paVar3,"file");
  archive_entry_set_mode(paVar3,0x81b4);
  archive_entry_set_size(paVar3,10);
  archive_entry_set_uid(paVar3,0x50);
  archive_entry_set_gid(paVar3,0x5a);
  archive_entry_set_dev(paVar3,0xc);
  archive_entry_set_ino(paVar3,0x59);
  archive_entry_set_nlink(paVar3,2);
  iVar1 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'f',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'h',10,"10",lVar4,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'k',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_set_pathname(paVar3,"linkfile");
  archive_entry_set_mode(paVar3,0x81b4);
  archive_entry_set_uid(paVar3,0x50);
  archive_entry_set_gid(paVar3,0x5a);
  archive_entry_set_dev(paVar3,0xc);
  archive_entry_set_ino(paVar3,0x59);
  archive_entry_set_nlink(paVar3,2);
  iVar1 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'w',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'z',0,"0",lVar4,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'}',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,2,0x14);
  archive_entry_set_pathname(paVar3,"dir");
  archive_entry_set_mode(paVar3,0x41fd);
  archive_entry_set_size(paVar3,10);
  archive_entry_set_nlink(paVar3,2);
  iVar1 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'\x84',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'\x87',0,"0",lVar4,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'\x8a',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,3,0x1e);
  archive_entry_set_pathname(paVar3,"symlink");
  archive_entry_set_mode(paVar3,0x1b4);
  archive_entry_set_filetype(paVar3,0xa000);
  archive_entry_set_symlink(paVar3,"file");
  archive_entry_set_size(paVar3,0);
  archive_entry_set_uid(paVar3,0x58);
  archive_entry_set_gid(paVar3,0x62);
  archive_entry_set_dev(paVar3,0xc);
  archive_entry_set_ino(paVar3,0x5a);
  archive_entry_set_nlink(paVar3,1);
  iVar1 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'\x97',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'\x9a',0,"0",lVar4,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'\x9d',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_set_pathname(paVar3,f99);
  archive_entry_set_mode(paVar3,0x81b4);
  archive_entry_set_size(paVar3,0);
  archive_entry_set_uid(paVar3,0x52);
  archive_entry_set_gid(paVar3,0x5d);
  archive_entry_set_dev(paVar3,0x66);
  archive_entry_set_ino(paVar3,7);
  archive_entry_set_nlink(paVar3,1);
  iVar1 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'¨',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'¬',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_set_pathname(paVar3,f100);
  archive_entry_set_mode(paVar3,0x81b4);
  archive_entry_set_size(paVar3,0);
  archive_entry_set_uid(paVar3,0x52);
  archive_entry_set_gid(paVar3,0x5d);
  archive_entry_set_dev(paVar3,0x66);
  archive_entry_set_ino(paVar3,7);
  archive_entry_set_nlink(paVar3,1);
  iVar1 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'·',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'»',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_set_pathname(paVar3,f256);
  archive_entry_set_mode(paVar3,0x81b4);
  archive_entry_set_size(paVar3,0);
  archive_entry_set_uid(paVar3,0x52);
  archive_entry_set_gid(paVar3,0x5d);
  archive_entry_set_dev(paVar3,0x66);
  archive_entry_set_ino(paVar3,7);
  archive_entry_set_nlink(paVar3,1);
  iVar1 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Æ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  iVar1 = archive_write_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ê',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ò',p,"e + 0","file","\"file\"",5,"5",(void *)0x0);
  p[0] = '\0';
  p[1] = '\0';
  p[2] = '\0';
  p[3] = '\0';
  p[4] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ó',p + 100,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  p[100] = '\0';
  p[0x65] = '\0';
  p[0x66] = '\0';
  p[0x67] = '\0';
  p[0x68] = '\0';
  p[0x69] = '\0';
  p[0x6a] = '\0';
  p[0x6b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ô',p + 0x6c,"e + 108","000120 ","\"000120 \"",8,"8",(void *)0x0);
  p[0x6c] = '\0';
  p[0x6d] = '\0';
  p[0x6e] = '\0';
  p[0x6f] = '\0';
  p[0x70] = '\0';
  p[0x71] = '\0';
  p[0x72] = '\0';
  p[0x73] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Õ',p + 0x74,"e + 116","000132 ","\"000132 \"",8,"8",(void *)0x0);
  p[0x74] = '\0';
  p[0x75] = '\0';
  p[0x76] = '\0';
  p[0x77] = '\0';
  p[0x78] = '\0';
  p[0x79] = '\0';
  p[0x7a] = '\0';
  p[0x7b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ö',p + 0x7c,"e + 124","00000000012 ","\"00000000012 \"",0xc,"12",
                      (void *)0x0);
  p[0x7c] = '\0';
  p[0x7d] = '\0';
  p[0x7e] = '\0';
  p[0x7f] = '\0';
  p[0x80] = '\0';
  p[0x81] = '\0';
  p[0x82] = '\0';
  p[0x83] = '\0';
  p[0x84] = '\0';
  p[0x85] = '\0';
  p[0x86] = '\0';
  p[0x87] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'×',p + 0x88,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  p[0x88] = '\0';
  p[0x89] = '\0';
  p[0x8a] = '\0';
  p[0x8b] = '\0';
  p[0x8c] = '\0';
  p[0x8d] = '\0';
  p[0x8e] = '\0';
  p[0x8f] = '\0';
  p[0x90] = '\0';
  p[0x91] = '\0';
  p[0x92] = '\0';
  p[0x93] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ø',p + 0x94,"e + 148","010034","\"010034\\0 \"",8,"8",(void *)0x0);
  p[0x94] = '\0';
  p[0x95] = '\0';
  p[0x96] = '\0';
  p[0x97] = '\0';
  p[0x98] = '\0';
  p[0x99] = '\0';
  p[0x9a] = '\0';
  p[0x9b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ù',p + 0x9c,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  p[0x9c] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ú',p + 0x9d,"e + 157","","\"\"",1,"1",(void *)0x0);
  p[0x9d] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Û',p + 0x101,"e + 257","ustar","\"ustar\\000000\"",8,"8",(void *)0x0);
  p[0x101] = '\0';
  p[0x102] = '\0';
  p[0x103] = '\0';
  p[0x104] = '\0';
  p[0x105] = '\0';
  p[0x106] = '\0';
  p[0x107] = '\0';
  p[0x108] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ü',p + 0x109,"e + 265","","\"\"",1,"1",(void *)0x0);
  p[0x109] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ý',p + 0x129,"e + 297","","\"\"",1,"1",(void *)0x0);
  p[0x129] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Þ',p + 0x149,"e + 329","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0x149] = '\0';
  p[0x14a] = '\0';
  p[0x14b] = '\0';
  p[0x14c] = '\0';
  p[0x14d] = '\0';
  p[0x14e] = '\0';
  p[0x14f] = '\0';
  p[0x150] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ß',p + 0x151,"e + 337","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0x151] = '\0';
  p[0x152] = '\0';
  p[0x153] = '\0';
  p[0x154] = '\0';
  p[0x155] = '\0';
  p[0x156] = '\0';
  p[0x157] = '\0';
  p[0x158] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'à',p + 0x159,"e + 345","","\"\"",1,"1",(void *)0x0);
  p[0x159] = '\0';
  wVar2 = is_null(p,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'á',wVar2,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'â',p + 0x200,"e + 512","1234567890","\"1234567890\"",10,"10",(void *)0x0);
  p[0x200] = '\0';
  p[0x201] = '\0';
  p[0x202] = '\0';
  p[0x203] = '\0';
  p[0x204] = '\0';
  p[0x205] = '\0';
  p[0x206] = '\0';
  p[0x207] = '\0';
  p[0x208] = '\0';
  p[0x209] = '\0';
  wVar2 = is_null(p + 0x200,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ã',wVar2,"is_null(e + 512, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ç',p + 0x400,"e + 0","linkfile","\"linkfile\"",9,"9",(void *)0x0);
  p[0x408] = '\0';
  p[0x400] = '\0';
  p[0x401] = '\0';
  p[0x402] = '\0';
  p[0x403] = '\0';
  p[0x404] = '\0';
  p[0x405] = '\0';
  p[0x406] = '\0';
  p[0x407] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'è',p + 0x464,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  p[0x464] = '\0';
  p[0x465] = '\0';
  p[0x466] = '\0';
  p[0x467] = '\0';
  p[0x468] = '\0';
  p[0x469] = '\0';
  p[0x46a] = '\0';
  p[0x46b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'é',p + 0x46c,"e + 108","000120 ","\"000120 \"",8,"8",(void *)0x0);
  p[0x46c] = '\0';
  p[0x46d] = '\0';
  p[0x46e] = '\0';
  p[0x46f] = '\0';
  p[0x470] = '\0';
  p[0x471] = '\0';
  p[0x472] = '\0';
  p[0x473] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ê',p + 0x474,"e + 116","000132 ","\"000132 \"",8,"8",(void *)0x0);
  p[0x474] = '\0';
  p[0x475] = '\0';
  p[0x476] = '\0';
  p[0x477] = '\0';
  p[0x478] = '\0';
  p[0x479] = '\0';
  p[0x47a] = '\0';
  p[0x47b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ë',p + 0x47c,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  p[0x47c] = '\0';
  p[0x47d] = '\0';
  p[0x47e] = '\0';
  p[0x47f] = '\0';
  p[0x480] = '\0';
  p[0x481] = '\0';
  p[0x482] = '\0';
  p[0x483] = '\0';
  p[0x484] = '\0';
  p[0x485] = '\0';
  p[0x486] = '\0';
  p[0x487] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ì',p + 0x488,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  p[0x488] = '\0';
  p[0x489] = '\0';
  p[0x48a] = '\0';
  p[0x48b] = '\0';
  p[0x48c] = '\0';
  p[0x48d] = '\0';
  p[0x48e] = '\0';
  p[0x48f] = '\0';
  p[0x490] = '\0';
  p[0x491] = '\0';
  p[0x492] = '\0';
  p[0x493] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'í',p + 0x494,"e + 148","010707","\"010707\\0 \"",8,"8",(void *)0x0);
  p[0x494] = '\0';
  p[0x495] = '\0';
  p[0x496] = '\0';
  p[0x497] = '\0';
  p[0x498] = '\0';
  p[0x499] = '\0';
  p[0x49a] = '\0';
  p[0x49b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'î',p + 0x49c,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  p[0x49c] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ï',p + 0x49d,"e + 157","","\"\"",1,"1",(void *)0x0);
  p[0x49d] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ð',p + 0x501,"e + 257","ustar","\"ustar\\000000\"",8,"8",(void *)0x0);
  p[0x501] = '\0';
  p[0x502] = '\0';
  p[0x503] = '\0';
  p[0x504] = '\0';
  p[0x505] = '\0';
  p[0x506] = '\0';
  p[0x507] = '\0';
  p[0x508] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ñ',p + 0x509,"e + 265","","\"\"",1,"1",(void *)0x0);
  p[0x509] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ò',p + 0x529,"e + 297","","\"\"",1,"1",(void *)0x0);
  p[0x529] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ó',p + 0x549,"e + 329","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0x549] = '\0';
  p[0x54a] = '\0';
  p[0x54b] = '\0';
  p[0x54c] = '\0';
  p[0x54d] = '\0';
  p[0x54e] = '\0';
  p[0x54f] = '\0';
  p[0x550] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ô',p + 0x551,"e + 337","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0x551] = '\0';
  p[0x552] = '\0';
  p[0x553] = '\0';
  p[0x554] = '\0';
  p[0x555] = '\0';
  p[0x556] = '\0';
  p[0x557] = '\0';
  p[0x558] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'õ',p + 0x559,"e + 345","","\"\"",1,"1",(void *)0x0);
  p[0x559] = '\0';
  wVar2 = is_null(p + 0x400,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ö',wVar2,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ú',p + 0x600,"e + 0","dir/","\"dir/\"",4,"4",(void *)0x0);
  p[0x600] = '\0';
  p[0x601] = '\0';
  p[0x602] = '\0';
  p[0x603] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'û',p + 0x664,"e + 100","000775 ","\"000775 \"",8,"8",(void *)0x0);
  p[0x664] = '\0';
  p[0x665] = '\0';
  p[0x666] = '\0';
  p[0x667] = '\0';
  p[0x668] = '\0';
  p[0x669] = '\0';
  p[0x66a] = '\0';
  p[0x66b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ü',p + 0x66c,"e + 108","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0x66c] = '\0';
  p[0x66d] = '\0';
  p[0x66e] = '\0';
  p[0x66f] = '\0';
  p[0x670] = '\0';
  p[0x671] = '\0';
  p[0x672] = '\0';
  p[0x673] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ý',p + 0x674,"e + 116","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0x674] = '\0';
  p[0x675] = '\0';
  p[0x676] = '\0';
  p[0x677] = '\0';
  p[0x678] = '\0';
  p[0x679] = '\0';
  p[0x67a] = '\0';
  p[0x67b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'þ',p + 0x67c,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  p[0x67c] = '\0';
  p[0x67d] = '\0';
  p[0x67e] = '\0';
  p[0x67f] = '\0';
  p[0x680] = '\0';
  p[0x681] = '\0';
  p[0x682] = '\0';
  p[0x683] = '\0';
  p[0x684] = '\0';
  p[0x685] = '\0';
  p[0x686] = '\0';
  p[0x687] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ÿ',p + 0x688,"e + 136","00000000002 ","\"00000000002 \"",0xc,"12",
                      (void *)0x0);
  p[0x688] = '\0';
  p[0x689] = '\0';
  p[0x68a] = '\0';
  p[0x68b] = '\0';
  p[0x68c] = '\0';
  p[0x68d] = '\0';
  p[0x68e] = '\0';
  p[0x68f] = '\0';
  p[0x690] = '\0';
  p[0x691] = '\0';
  p[0x692] = '\0';
  p[0x693] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ā',p + 0x694,"e + 148","007747","\"007747\\0 \"",8,"8",(void *)0x0);
  p[0x694] = '\0';
  p[0x695] = '\0';
  p[0x696] = '\0';
  p[0x697] = '\0';
  p[0x698] = '\0';
  p[0x699] = '\0';
  p[0x69a] = '\0';
  p[0x69b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ā',p + 0x69c,"e + 156","5","\"5\"",1,"1",(void *)0x0);
  p[0x69c] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ă',p + 0x69d,"e + 157","","\"\"",1,"1",(void *)0x0);
  p[0x69d] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ă',p + 0x701,"e + 257","ustar","\"ustar\\000000\"",8,"8",(void *)0x0);
  p[0x701] = '\0';
  p[0x702] = '\0';
  p[0x703] = '\0';
  p[0x704] = '\0';
  p[0x705] = '\0';
  p[0x706] = '\0';
  p[0x707] = '\0';
  p[0x708] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ą',p + 0x709,"e + 265","","\"\"",1,"1",(void *)0x0);
  p[0x709] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ą',p + 0x729,"e + 297","","\"\"",1,"1",(void *)0x0);
  p[0x729] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ć',p + 0x749,"e + 329","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0x749] = '\0';
  p[0x74a] = '\0';
  p[0x74b] = '\0';
  p[0x74c] = '\0';
  p[0x74d] = '\0';
  p[0x74e] = '\0';
  p[0x74f] = '\0';
  p[0x750] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ć',p + 0x751,"e + 337","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0x751] = '\0';
  p[0x752] = '\0';
  p[0x753] = '\0';
  p[0x754] = '\0';
  p[0x755] = '\0';
  p[0x756] = '\0';
  p[0x757] = '\0';
  p[0x758] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĉ',p + 0x759,"e + 345","","\"\"",1,"1",(void *)0x0);
  p[0x759] = '\0';
  wVar2 = is_null(p + 0x600,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ĉ',wVar2,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'č',p + 0x800,"e + 0","symlink","\"symlink\"",8,"8",(void *)0x0);
  p[0x800] = '\0';
  p[0x801] = '\0';
  p[0x802] = '\0';
  p[0x803] = '\0';
  p[0x804] = '\0';
  p[0x805] = '\0';
  p[0x806] = '\0';
  p[0x807] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ď',p + 0x864,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  p[0x864] = '\0';
  p[0x865] = '\0';
  p[0x866] = '\0';
  p[0x867] = '\0';
  p[0x868] = '\0';
  p[0x869] = '\0';
  p[0x86a] = '\0';
  p[0x86b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ď',p + 0x86c,"e + 108","000130 ","\"000130 \"",8,"8",(void *)0x0);
  p[0x86c] = '\0';
  p[0x86d] = '\0';
  p[0x86e] = '\0';
  p[0x86f] = '\0';
  p[0x870] = '\0';
  p[0x871] = '\0';
  p[0x872] = '\0';
  p[0x873] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Đ',p + 0x874,"e + 116","000142 ","\"000142 \"",8,"8",(void *)0x0);
  p[0x874] = '\0';
  p[0x875] = '\0';
  p[0x876] = '\0';
  p[0x877] = '\0';
  p[0x878] = '\0';
  p[0x879] = '\0';
  p[0x87a] = '\0';
  p[0x87b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'đ',p + 0x87c,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  p[0x87c] = '\0';
  p[0x87d] = '\0';
  p[0x87e] = '\0';
  p[0x87f] = '\0';
  p[0x880] = '\0';
  p[0x881] = '\0';
  p[0x882] = '\0';
  p[0x883] = '\0';
  p[0x884] = '\0';
  p[0x885] = '\0';
  p[0x886] = '\0';
  p[0x887] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ē',p + 0x888,"e + 136","00000000003 ","\"00000000003 \"",0xc,"12",
                      (void *)0x0);
  p[0x888] = '\0';
  p[0x889] = '\0';
  p[0x88a] = '\0';
  p[0x88b] = '\0';
  p[0x88c] = '\0';
  p[0x88d] = '\0';
  p[0x88e] = '\0';
  p[0x88f] = '\0';
  p[0x890] = '\0';
  p[0x891] = '\0';
  p[0x892] = '\0';
  p[0x893] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ē',p + 0x894,"e + 148","011446","\"011446\\0 \"",8,"8",(void *)0x0);
  p[0x894] = '\0';
  p[0x895] = '\0';
  p[0x896] = '\0';
  p[0x897] = '\0';
  p[0x898] = '\0';
  p[0x899] = '\0';
  p[0x89a] = '\0';
  p[0x89b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĕ',p + 0x89c,"e + 156","2","\"2\"",1,"1",(void *)0x0);
  p[0x89c] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĕ',p + 0x89d,"e + 157","file","\"file\"",5,"5",(void *)0x0);
  p[0x8a1] = '\0';
  p[0x89d] = '\0';
  p[0x89e] = '\0';
  p[0x89f] = '\0';
  p[0x8a0] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ė',p + 0x901,"e + 257","ustar","\"ustar\\000000\"",8,"8",(void *)0x0);
  p[0x901] = '\0';
  p[0x902] = '\0';
  p[0x903] = '\0';
  p[0x904] = '\0';
  p[0x905] = '\0';
  p[0x906] = '\0';
  p[0x907] = '\0';
  p[0x908] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ė',p + 0x909,"e + 265","","\"\"",1,"1",(void *)0x0);
  p[0x909] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ę',p + 0x929,"e + 297","","\"\"",1,"1",(void *)0x0);
  p[0x929] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ę',p + 0x949,"e + 329","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0x949] = '\0';
  p[0x94a] = '\0';
  p[0x94b] = '\0';
  p[0x94c] = '\0';
  p[0x94d] = '\0';
  p[0x94e] = '\0';
  p[0x94f] = '\0';
  p[0x950] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ě',p + 0x951,"e + 337","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0x951] = '\0';
  p[0x952] = '\0';
  p[0x953] = '\0';
  p[0x954] = '\0';
  p[0x955] = '\0';
  p[0x956] = '\0';
  p[0x957] = '\0';
  p[0x958] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ě',p + 0x959,"e + 345","","\"\"",1,"1",(void *)0x0);
  p[0x959] = '\0';
  wVar2 = is_null(p + 0x800,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'Ĝ',wVar2,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ġ',p + 0xa00,"e + 0",f99,"f99",100,"100",(void *)0x0);
  p[0xa00] = '\0';
  p[0xa01] = '\0';
  p[0xa02] = '\0';
  p[0xa03] = '\0';
  p[0xa04] = '\0';
  p[0xa05] = '\0';
  p[0xa06] = '\0';
  p[0xa07] = '\0';
  p[0xa08] = '\0';
  p[0xa09] = '\0';
  p[0xa0a] = '\0';
  p[0xa0b] = '\0';
  p[0xa0c] = '\0';
  p[0xa0d] = '\0';
  p[0xa0e] = '\0';
  p[0xa0f] = '\0';
  p[0xa10] = '\0';
  p[0xa11] = '\0';
  p[0xa12] = '\0';
  p[0xa13] = '\0';
  p[0xa14] = '\0';
  p[0xa15] = '\0';
  p[0xa16] = '\0';
  p[0xa17] = '\0';
  p[0xa18] = '\0';
  p[0xa19] = '\0';
  p[0xa1a] = '\0';
  p[0xa1b] = '\0';
  p[0xa1c] = '\0';
  p[0xa1d] = '\0';
  p[0xa1e] = '\0';
  p[0xa1f] = '\0';
  p[0xa20] = '\0';
  p[0xa21] = '\0';
  p[0xa22] = '\0';
  p[0xa23] = '\0';
  p[0xa24] = '\0';
  p[0xa25] = '\0';
  p[0xa26] = '\0';
  p[0xa27] = '\0';
  p[0xa28] = '\0';
  p[0xa29] = '\0';
  p[0xa2a] = '\0';
  p[0xa2b] = '\0';
  p[0xa2c] = '\0';
  p[0xa2d] = '\0';
  p[0xa2e] = '\0';
  p[0xa2f] = '\0';
  p[0xa30] = '\0';
  p[0xa31] = '\0';
  p[0xa32] = '\0';
  p[0xa33] = '\0';
  p[0xa34] = '\0';
  p[0xa35] = '\0';
  p[0xa36] = '\0';
  p[0xa37] = '\0';
  p[0xa38] = '\0';
  p[0xa39] = '\0';
  p[0xa3a] = '\0';
  p[0xa3b] = '\0';
  p[0xa3c] = '\0';
  p[0xa3d] = '\0';
  p[0xa3e] = '\0';
  p[0xa3f] = '\0';
  p[0xa40] = '\0';
  p[0xa41] = '\0';
  p[0xa42] = '\0';
  p[0xa43] = '\0';
  p[0xa44] = '\0';
  p[0xa45] = '\0';
  p[0xa46] = '\0';
  p[0xa47] = '\0';
  p[0xa48] = '\0';
  p[0xa49] = '\0';
  p[0xa4a] = '\0';
  p[0xa4b] = '\0';
  p[0xa4c] = '\0';
  p[0xa4d] = '\0';
  p[0xa4e] = '\0';
  p[0xa4f] = '\0';
  p[0xa50] = '\0';
  p[0xa51] = '\0';
  p[0xa52] = '\0';
  p[0xa53] = '\0';
  p[0xa54] = '\0';
  p[0xa55] = '\0';
  p[0xa56] = '\0';
  p[0xa57] = '\0';
  p[0xa58] = '\0';
  p[0xa59] = '\0';
  p[0xa5a] = '\0';
  p[0xa5b] = '\0';
  p[0xa5c] = '\0';
  p[0xa5d] = '\0';
  p[0xa5e] = '\0';
  p[0xa5f] = '\0';
  p[0xa60] = '\0';
  p[0xa61] = '\0';
  p[0xa62] = '\0';
  p[0xa63] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ġ',p + 0xa64,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  p[0xa64] = '\0';
  p[0xa65] = '\0';
  p[0xa66] = '\0';
  p[0xa67] = '\0';
  p[0xa68] = '\0';
  p[0xa69] = '\0';
  p[0xa6a] = '\0';
  p[0xa6b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ģ',p + 0xa6c,"e + 108","000122 ","\"000122 \"",8,"8",(void *)0x0);
  p[0xa6c] = '\0';
  p[0xa6d] = '\0';
  p[0xa6e] = '\0';
  p[0xa6f] = '\0';
  p[0xa70] = '\0';
  p[0xa71] = '\0';
  p[0xa72] = '\0';
  p[0xa73] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ģ',p + 0xa74,"e + 116","000135 ","\"000135 \"",8,"8",(void *)0x0);
  p[0xa74] = '\0';
  p[0xa75] = '\0';
  p[0xa76] = '\0';
  p[0xa77] = '\0';
  p[0xa78] = '\0';
  p[0xa79] = '\0';
  p[0xa7a] = '\0';
  p[0xa7b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĥ',p + 0xa7c,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  p[0xa7c] = '\0';
  p[0xa7d] = '\0';
  p[0xa7e] = '\0';
  p[0xa7f] = '\0';
  p[0xa80] = '\0';
  p[0xa81] = '\0';
  p[0xa82] = '\0';
  p[0xa83] = '\0';
  p[0xa84] = '\0';
  p[0xa85] = '\0';
  p[0xa86] = '\0';
  p[0xa87] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĥ',p + 0xa88,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  p[0xa88] = '\0';
  p[0xa89] = '\0';
  p[0xa8a] = '\0';
  p[0xa8b] = '\0';
  p[0xa8c] = '\0';
  p[0xa8d] = '\0';
  p[0xa8e] = '\0';
  p[0xa8f] = '\0';
  p[0xa90] = '\0';
  p[0xa91] = '\0';
  p[0xa92] = '\0';
  p[0xa93] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ħ',p + 0xa94,"e + 148","034242","\"034242\\0 \"",8,"8",(void *)0x0);
  p[0xa94] = '\0';
  p[0xa95] = '\0';
  p[0xa96] = '\0';
  p[0xa97] = '\0';
  p[0xa98] = '\0';
  p[0xa99] = '\0';
  p[0xa9a] = '\0';
  p[0xa9b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ħ',p + 0xa9c,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  p[0xa9c] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĩ',p + 0xa9d,"e + 157","","\"\"",1,"1",(void *)0x0);
  p[0xa9d] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĩ',p + 0xb01,"e + 257","ustar","\"ustar\\000000\"",8,"8",(void *)0x0);
  p[0xb01] = '\0';
  p[0xb02] = '\0';
  p[0xb03] = '\0';
  p[0xb04] = '\0';
  p[0xb05] = '\0';
  p[0xb06] = '\0';
  p[0xb07] = '\0';
  p[0xb08] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ī',p + 0xb09,"e + 265","","\"\"",1,"1",(void *)0x0);
  p[0xb09] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ī',p + 0xb29,"e + 297","","\"\"",1,"1",(void *)0x0);
  p[0xb29] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĭ',p + 0xb49,"e + 329","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0xb49] = '\0';
  p[0xb4a] = '\0';
  p[0xb4b] = '\0';
  p[0xb4c] = '\0';
  p[0xb4d] = '\0';
  p[0xb4e] = '\0';
  p[0xb4f] = '\0';
  p[0xb50] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĭ',p + 0xb51,"e + 337","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0xb51] = '\0';
  p[0xb52] = '\0';
  p[0xb53] = '\0';
  p[0xb54] = '\0';
  p[0xb55] = '\0';
  p[0xb56] = '\0';
  p[0xb57] = '\0';
  p[0xb58] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Į',p + 0xb59,"e + 345","","\"\"",1,"1",(void *)0x0);
  p[0xb59] = '\0';
  wVar2 = is_null(p + 0xa00,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'į',wVar2,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĳ',p + 0xc00,"e + 0",f100,"f100",100,"100",(void *)0x0);
  p[0xc00] = '\0';
  p[0xc01] = '\0';
  p[0xc02] = '\0';
  p[0xc03] = '\0';
  p[0xc04] = '\0';
  p[0xc05] = '\0';
  p[0xc06] = '\0';
  p[0xc07] = '\0';
  p[0xc08] = '\0';
  p[0xc09] = '\0';
  p[0xc0a] = '\0';
  p[0xc0b] = '\0';
  p[0xc0c] = '\0';
  p[0xc0d] = '\0';
  p[0xc0e] = '\0';
  p[0xc0f] = '\0';
  p[0xc10] = '\0';
  p[0xc11] = '\0';
  p[0xc12] = '\0';
  p[0xc13] = '\0';
  p[0xc14] = '\0';
  p[0xc15] = '\0';
  p[0xc16] = '\0';
  p[0xc17] = '\0';
  p[0xc18] = '\0';
  p[0xc19] = '\0';
  p[0xc1a] = '\0';
  p[0xc1b] = '\0';
  p[0xc1c] = '\0';
  p[0xc1d] = '\0';
  p[0xc1e] = '\0';
  p[0xc1f] = '\0';
  p[0xc20] = '\0';
  p[0xc21] = '\0';
  p[0xc22] = '\0';
  p[0xc23] = '\0';
  p[0xc24] = '\0';
  p[0xc25] = '\0';
  p[0xc26] = '\0';
  p[0xc27] = '\0';
  p[0xc28] = '\0';
  p[0xc29] = '\0';
  p[0xc2a] = '\0';
  p[0xc2b] = '\0';
  p[0xc2c] = '\0';
  p[0xc2d] = '\0';
  p[0xc2e] = '\0';
  p[0xc2f] = '\0';
  p[0xc30] = '\0';
  p[0xc31] = '\0';
  p[0xc32] = '\0';
  p[0xc33] = '\0';
  p[0xc34] = '\0';
  p[0xc35] = '\0';
  p[0xc36] = '\0';
  p[0xc37] = '\0';
  p[0xc38] = '\0';
  p[0xc39] = '\0';
  p[0xc3a] = '\0';
  p[0xc3b] = '\0';
  p[0xc3c] = '\0';
  p[0xc3d] = '\0';
  p[0xc3e] = '\0';
  p[0xc3f] = '\0';
  p[0xc40] = '\0';
  p[0xc41] = '\0';
  p[0xc42] = '\0';
  p[0xc43] = '\0';
  p[0xc44] = '\0';
  p[0xc45] = '\0';
  p[0xc46] = '\0';
  p[0xc47] = '\0';
  p[0xc48] = '\0';
  p[0xc49] = '\0';
  p[0xc4a] = '\0';
  p[0xc4b] = '\0';
  p[0xc4c] = '\0';
  p[0xc4d] = '\0';
  p[0xc4e] = '\0';
  p[0xc4f] = '\0';
  p[0xc50] = '\0';
  p[0xc51] = '\0';
  p[0xc52] = '\0';
  p[0xc53] = '\0';
  p[0xc54] = '\0';
  p[0xc55] = '\0';
  p[0xc56] = '\0';
  p[0xc57] = '\0';
  p[0xc58] = '\0';
  p[0xc59] = '\0';
  p[0xc5a] = '\0';
  p[0xc5b] = '\0';
  p[0xc5c] = '\0';
  p[0xc5d] = '\0';
  p[0xc5e] = '\0';
  p[0xc5f] = '\0';
  p[0xc60] = '\0';
  p[0xc61] = '\0';
  p[0xc62] = '\0';
  p[0xc63] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĵ',p + 0xc64,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  p[0xc64] = '\0';
  p[0xc65] = '\0';
  p[0xc66] = '\0';
  p[0xc67] = '\0';
  p[0xc68] = '\0';
  p[0xc69] = '\0';
  p[0xc6a] = '\0';
  p[0xc6b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĵ',p + 0xc6c,"e + 108","000122 ","\"000122 \"",8,"8",(void *)0x0);
  p[0xc6c] = '\0';
  p[0xc6d] = '\0';
  p[0xc6e] = '\0';
  p[0xc6f] = '\0';
  p[0xc70] = '\0';
  p[0xc71] = '\0';
  p[0xc72] = '\0';
  p[0xc73] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ķ',p + 0xc74,"e + 116","000135 ","\"000135 \"",8,"8",(void *)0x0);
  p[0xc74] = '\0';
  p[0xc75] = '\0';
  p[0xc76] = '\0';
  p[0xc77] = '\0';
  p[0xc78] = '\0';
  p[0xc79] = '\0';
  p[0xc7a] = '\0';
  p[0xc7b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ķ',p + 0xc7c,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  p[0xc7c] = '\0';
  p[0xc7d] = '\0';
  p[0xc7e] = '\0';
  p[0xc7f] = '\0';
  p[0xc80] = '\0';
  p[0xc81] = '\0';
  p[0xc82] = '\0';
  p[0xc83] = '\0';
  p[0xc84] = '\0';
  p[0xc85] = '\0';
  p[0xc86] = '\0';
  p[0xc87] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĸ',p + 0xc88,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  p[0xc88] = '\0';
  p[0xc89] = '\0';
  p[0xc8a] = '\0';
  p[0xc8b] = '\0';
  p[0xc8c] = '\0';
  p[0xc8d] = '\0';
  p[0xc8e] = '\0';
  p[0xc8f] = '\0';
  p[0xc90] = '\0';
  p[0xc91] = '\0';
  p[0xc92] = '\0';
  p[0xc93] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĺ',p + 0xc94,"e + 148","026230","\"026230\\0 \"",8,"8",(void *)0x0);
  p[0xc94] = '\0';
  p[0xc95] = '\0';
  p[0xc96] = '\0';
  p[0xc97] = '\0';
  p[0xc98] = '\0';
  p[0xc99] = '\0';
  p[0xc9a] = '\0';
  p[0xc9b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĺ',p + 0xc9c,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  p[0xc9c] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ļ',p + 0xc9d,"e + 157","","\"\"",1,"1",(void *)0x0);
  p[0xc9d] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ļ',p + 0xd01,"e + 257","ustar","\"ustar\\000000\"",8,"8",(void *)0x0);
  p[0xd01] = '\0';
  p[0xd02] = '\0';
  p[0xd03] = '\0';
  p[0xd04] = '\0';
  p[0xd05] = '\0';
  p[0xd06] = '\0';
  p[0xd07] = '\0';
  p[0xd08] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ľ',p + 0xd09,"e + 265","","\"\"",1,"1",(void *)0x0);
  p[0xd09] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ľ',p + 0xd29,"e + 297","","\"\"",1,"1",(void *)0x0);
  p[0xd29] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ŀ',p + 0xd49,"e + 329","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0xd49] = '\0';
  p[0xd4a] = '\0';
  p[0xd4b] = '\0';
  p[0xd4c] = '\0';
  p[0xd4d] = '\0';
  p[0xd4e] = '\0';
  p[0xd4f] = '\0';
  p[0xd50] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ŀ',p + 0xd51,"e + 337","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0xd51] = '\0';
  p[0xd52] = '\0';
  p[0xd53] = '\0';
  p[0xd54] = '\0';
  p[0xd55] = '\0';
  p[0xd56] = '\0';
  p[0xd57] = '\0';
  p[0xd58] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ł',p + 0xd59,"e + 345","","\"\"",1,"1",(void *)0x0);
  p[0xd59] = '\0';
  wVar2 = is_null(p + 0xc00,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ł',wVar2,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ņ',p + 0xe00,"e + 0",f256 + 0x9c,"f256 + 156",100,"100",(void *)0x0);
  p[0xe00] = '\0';
  p[0xe01] = '\0';
  p[0xe02] = '\0';
  p[0xe03] = '\0';
  p[0xe04] = '\0';
  p[0xe05] = '\0';
  p[0xe06] = '\0';
  p[0xe07] = '\0';
  p[0xe08] = '\0';
  p[0xe09] = '\0';
  p[0xe0a] = '\0';
  p[0xe0b] = '\0';
  p[0xe0c] = '\0';
  p[0xe0d] = '\0';
  p[0xe0e] = '\0';
  p[0xe0f] = '\0';
  p[0xe10] = '\0';
  p[0xe11] = '\0';
  p[0xe12] = '\0';
  p[0xe13] = '\0';
  p[0xe14] = '\0';
  p[0xe15] = '\0';
  p[0xe16] = '\0';
  p[0xe17] = '\0';
  p[0xe18] = '\0';
  p[0xe19] = '\0';
  p[0xe1a] = '\0';
  p[0xe1b] = '\0';
  p[0xe1c] = '\0';
  p[0xe1d] = '\0';
  p[0xe1e] = '\0';
  p[0xe1f] = '\0';
  p[0xe20] = '\0';
  p[0xe21] = '\0';
  p[0xe22] = '\0';
  p[0xe23] = '\0';
  p[0xe24] = '\0';
  p[0xe25] = '\0';
  p[0xe26] = '\0';
  p[0xe27] = '\0';
  p[0xe28] = '\0';
  p[0xe29] = '\0';
  p[0xe2a] = '\0';
  p[0xe2b] = '\0';
  p[0xe2c] = '\0';
  p[0xe2d] = '\0';
  p[0xe2e] = '\0';
  p[0xe2f] = '\0';
  p[0xe30] = '\0';
  p[0xe31] = '\0';
  p[0xe32] = '\0';
  p[0xe33] = '\0';
  p[0xe34] = '\0';
  p[0xe35] = '\0';
  p[0xe36] = '\0';
  p[0xe37] = '\0';
  p[0xe38] = '\0';
  p[0xe39] = '\0';
  p[0xe3a] = '\0';
  p[0xe3b] = '\0';
  p[0xe3c] = '\0';
  p[0xe3d] = '\0';
  p[0xe3e] = '\0';
  p[0xe3f] = '\0';
  p[0xe40] = '\0';
  p[0xe41] = '\0';
  p[0xe42] = '\0';
  p[0xe43] = '\0';
  p[0xe44] = '\0';
  p[0xe45] = '\0';
  p[0xe46] = '\0';
  p[0xe47] = '\0';
  p[0xe48] = '\0';
  p[0xe49] = '\0';
  p[0xe4a] = '\0';
  p[0xe4b] = '\0';
  p[0xe4c] = '\0';
  p[0xe4d] = '\0';
  p[0xe4e] = '\0';
  p[0xe4f] = '\0';
  p[0xe50] = '\0';
  p[0xe51] = '\0';
  p[0xe52] = '\0';
  p[0xe53] = '\0';
  p[0xe54] = '\0';
  p[0xe55] = '\0';
  p[0xe56] = '\0';
  p[0xe57] = '\0';
  p[0xe58] = '\0';
  p[0xe59] = '\0';
  p[0xe5a] = '\0';
  p[0xe5b] = '\0';
  p[0xe5c] = '\0';
  p[0xe5d] = '\0';
  p[0xe5e] = '\0';
  p[0xe5f] = '\0';
  p[0xe60] = '\0';
  p[0xe61] = '\0';
  p[0xe62] = '\0';
  p[0xe63] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ň',p + 0xe64,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  p[0xe64] = '\0';
  p[0xe65] = '\0';
  p[0xe66] = '\0';
  p[0xe67] = '\0';
  p[0xe68] = '\0';
  p[0xe69] = '\0';
  p[0xe6a] = '\0';
  p[0xe6b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ň',p + 0xe6c,"e + 108","000122 ","\"000122 \"",8,"8",(void *)0x0);
  p[0xe6c] = '\0';
  p[0xe6d] = '\0';
  p[0xe6e] = '\0';
  p[0xe6f] = '\0';
  p[0xe70] = '\0';
  p[0xe71] = '\0';
  p[0xe72] = '\0';
  p[0xe73] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ŉ',p + 0xe74,"e + 116","000135 ","\"000135 \"",8,"8",(void *)0x0);
  p[0xe74] = '\0';
  p[0xe75] = '\0';
  p[0xe76] = '\0';
  p[0xe77] = '\0';
  p[0xe78] = '\0';
  p[0xe79] = '\0';
  p[0xe7a] = '\0';
  p[0xe7b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ŋ',p + 0xe7c,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  p[0xe7c] = '\0';
  p[0xe7d] = '\0';
  p[0xe7e] = '\0';
  p[0xe7f] = '\0';
  p[0xe80] = '\0';
  p[0xe81] = '\0';
  p[0xe82] = '\0';
  p[0xe83] = '\0';
  p[0xe84] = '\0';
  p[0xe85] = '\0';
  p[0xe86] = '\0';
  p[0xe87] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ŋ',p + 0xe88,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  p[0xe88] = '\0';
  p[0xe89] = '\0';
  p[0xe8a] = '\0';
  p[0xe8b] = '\0';
  p[0xe8c] = '\0';
  p[0xe8d] = '\0';
  p[0xe8e] = '\0';
  p[0xe8f] = '\0';
  p[0xe90] = '\0';
  p[0xe91] = '\0';
  p[0xe92] = '\0';
  p[0xe93] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ō',p + 0xe94,"e + 148","055570","\"055570\\0 \"",8,"8",(void *)0x0);
  p[0xe94] = '\0';
  p[0xe95] = '\0';
  p[0xe96] = '\0';
  p[0xe97] = '\0';
  p[0xe98] = '\0';
  p[0xe99] = '\0';
  p[0xe9a] = '\0';
  p[0xe9b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ō',p + 0xe9c,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  p[0xe9c] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ŏ',p + 0xe9d,"e + 157","","\"\"",1,"1",(void *)0x0);
  p[0xe9d] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ŏ',p + 0xf01,"e + 257","ustar","\"ustar\\000000\"",8,"8",(void *)0x0);
  p[0xf01] = '\0';
  p[0xf02] = '\0';
  p[0xf03] = '\0';
  p[0xf04] = '\0';
  p[0xf05] = '\0';
  p[0xf06] = '\0';
  p[0xf07] = '\0';
  p[0xf08] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ő',p + 0xf09,"e + 265","","\"\"",1,"1",(void *)0x0);
  p[0xf09] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ő',p + 0xf29,"e + 297","","\"\"",1,"1",(void *)0x0);
  p[0xf29] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Œ',p + 0xf49,"e + 329","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0xf49] = '\0';
  p[0xf4a] = '\0';
  p[0xf4b] = '\0';
  p[0xf4c] = '\0';
  p[0xf4d] = '\0';
  p[0xf4e] = '\0';
  p[0xf4f] = '\0';
  p[0xf50] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'œ',p + 0xf51,"e + 337","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0xf51] = '\0';
  p[0xf52] = '\0';
  p[0xf53] = '\0';
  p[0xf54] = '\0';
  p[0xf55] = '\0';
  p[0xf56] = '\0';
  p[0xf57] = '\0';
  p[0xf58] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ŕ',p + 0xf59,"e + 345",f256,"f256",0x9b,"155",(void *)0x0);
  memset(p + 0xf59,0,0x9b);
  wVar2 = is_null(p + 0xe00,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ŕ',wVar2,"is_null(e + 0, 512)",(void *)0x0);
  wVar2 = is_null(p + 0x1000,0x400);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ś',wVar2,"is_null(e, 1024)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ş',(long)(int)used,"(int)used",0x1400,"e - buff",(void *)0x0);
  free(p);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_tar_ustar)
{
	struct archive *a;
	struct archive_entry *entry;
	char *buff, *e;
	size_t buffsize = 100000;
	size_t used;
	int i;
	char f99[100];
	char f100[101];
	char f256[257];

	for (i = 0; i < 99; ++i)
		f99[i] = 'a' + i % 26;
	f99[99] = '\0';

	for (i = 0; i < 100; ++i)
		f100[i] = 'A' + i % 26;
	f100[100] = '\0';

	for (i = 0; i < 256; ++i)
		f256[i] = 'A' + i % 26;
	f256[155] = '/';
	f256[256] = '\0';

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Add various files to it.
	 * TODO: Extend this to cover more filetypes.
	 */

	/* "file" with 10 bytes of content */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, "file");
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 10);
	archive_entry_set_uid(entry, 80);
	archive_entry_set_gid(entry, 90);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 89);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualIntA(a, 10, archive_write_data(a, "1234567890", 10));

	/* Hardlink to "file" with 10 bytes of content */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, "linkfile");
	archive_entry_set_mode(entry, S_IFREG | 0664);
	/* TODO: Put this back and fix the bug. */
	/* archive_entry_set_size(entry, 10); */
	archive_entry_set_uid(entry, 80);
	archive_entry_set_gid(entry, 90);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 89);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to dir should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* "dir" */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 2, 20);
	archive_entry_set_pathname(entry, "dir");
	archive_entry_set_mode(entry, S_IFDIR | 0775);
	archive_entry_set_size(entry, 10);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to dir should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* "symlink" pointing to "file" */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 3, 30);
	archive_entry_set_pathname(entry, "symlink");
	archive_entry_set_mode(entry, 0664);
	archive_entry_set_filetype(entry, AE_IFLNK);
	archive_entry_set_symlink(entry,"file");
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 88);
	archive_entry_set_gid(entry, 98);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 90);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to symlink should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* file with 99-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f99);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);

	/* file with 100-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f100);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);

	/* file with 256-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f256);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);

	/* Close out the archive. */
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Verify the archive format.
	 */
	e = buff;

	/* "file" */
	myAssertEqualMem(e + 0, "file", 5); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000120 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000132 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000012 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "010034\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	myAssertEqualMem(e + 512, "1234567890", 10);
	assert(is_null(e + 512, 512));
	e += 1024;

	/* hardlink to "file" */
	myAssertEqualMem(e + 0, "linkfile", 9); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000120 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000132 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "010707\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* "dir" */
	myAssertEqualMem(e + 0, "dir/", 4); /* Filename */
	myAssertEqualMem(e + 100, "000775 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000000 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000000 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000002 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "007747\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "5", 1); /* typeflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* "symlink" pointing to "file" */
	myAssertEqualMem(e + 0, "symlink", 8); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000130 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000142 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000003 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "011446\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "2", 1); /* linkflag */
	myAssertEqualMem(e + 157, "file", 5); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 99-char filename */
	myAssertEqualMem(e + 0, f99, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "034242\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 100-char filename */
	myAssertEqualMem(e + 0, f100, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "026230\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 256-char filename */
	myAssertEqualMem(e + 0, f256 + 156, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "055570\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, f256, 155); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* TODO: Verify other types of entries. */

	/* Last entry is end-of-archive marker. */
	assert(is_null(e, 1024));
	e += 1024;

	assertEqualInt((int)used, e - buff);

	free(buff);
}